

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  uint8_t *puVar1;
  LogMessageFatal aLStack_18 [16];
  
  puVar1 = (uint8_t *)google::protobuf::io::EpsCopyOutputStream::FlushAndResetBuffer((uchar *)this);
  this->cur_ = puVar1;
  if (puVar1 != (uint8_t *)0x0) {
    return (this->impl_).had_error_;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
             ,0x426,4,"cur_");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    ABSL_DCHECK(cur_);
    return impl_.HadError();
  }